

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

iterator __thiscall
QMultiMap<QSsl::AlternativeNameEntryType,_QString>::insert
          (QMultiMap<QSsl::AlternativeNameEntryType,_QString> *this,AlternativeNameEntryType *key,
          QString *value)

{
  bool bVar1;
  QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>
  *pQVar2;
  long in_FS_OFFSET;
  iterator i;
  QMultiMap<QSsl::AlternativeNameEntryType,_QString> copy;
  multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>
  *in_stack_ffffffffffffff78;
  iterator it;
  QMultiMap<QSsl::AlternativeNameEntryType,_QString> *in_stack_ffffffffffffff80;
  pair<const_QSsl::AlternativeNameEntryType,_QString> *this_00;
  const_iterator in_stack_ffffffffffffff98;
  pair<const_QSsl::AlternativeNameEntryType,_QString> local_48;
  _Rb_tree_const_iterator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_> local_28;
  iterator local_20;
  undefined8 local_18;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffff80->d);
  if (bVar1) {
    QMultiMap(in_stack_ffffffffffffff80,
              (QMultiMap<QSsl::AlternativeNameEntryType,_QString> *)in_stack_ffffffffffffff78);
  }
  else {
    memset(&local_18,0,8);
    QMultiMap((QMultiMap<QSsl::AlternativeNameEntryType,_QString> *)0x111598);
  }
  detach(in_stack_ffffffffffffff80);
  local_20._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>_>
                *)0x1115bb);
  local_20._M_node =
       (_Base_ptr)
       std::
       multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>
       ::lower_bound(in_stack_ffffffffffffff78,(key_type *)0x1115cc);
  pQVar2 = QtPrivate::
           QExplicitlySharedDataPointerV2<QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>_>
           ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>_>
                         *)0x1115db);
  it._M_node = (_Base_ptr)&pQVar2->m;
  std::_Rb_tree_const_iterator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>::
  _Rb_tree_const_iterator(&local_28,&local_20);
  this_00 = &local_48;
  std::pair<const_QSsl::AlternativeNameEntryType,_QString>::
  pair<const_QSsl::AlternativeNameEntryType,_QString,_true>
            (this_00,&(it._M_node)->_M_color,(QString *)0x11160b);
  std::
  multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>
  ::insert((multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>
            *)this_00,in_stack_ffffffffffffff98,(value_type *)it._M_node);
  iterator::iterator((iterator *)0x111632,it);
  std::pair<const_QSsl::AlternativeNameEntryType,_QString>::~pair
            ((pair<const_QSsl::AlternativeNameEntryType,_QString> *)0x11163c);
  ~QMultiMap((QMultiMap<QSsl::AlternativeNameEntryType,_QString> *)0x111646);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)(iterator)local_10._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const Key &key, const T &value)
    {
        const auto copy = d.isShared() ? *this : QMultiMap(); // keep `key`/`value` alive across the detach
        detach();
        // note that std::multimap inserts at the end of an equal_range for a key,
        // QMultiMap at the beginning.
        auto i = d->m.lower_bound(key);
        return iterator(d->m.insert(i, {key, value}));
    }